

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::HardSigmoid_x86_avx512::forward_inplace
          (HardSigmoid_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 (*pauVar5) [64];
  int iVar6;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined4 uVar16;
  
  iVar2 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar4 = 0;
  uVar3 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar3 = uVar4;
  }
  auVar9 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  auVar12._16_4_ = 0x3f800000;
  auVar12._20_4_ = 0x3f800000;
  auVar12._24_4_ = 0x3f800000;
  auVar12._28_4_ = 0x3f800000;
  auVar13._8_4_ = 0x3f800000;
  auVar13._0_8_ = 0x3f8000003f800000;
  auVar13._12_4_ = 0x3f800000;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    pauVar5 = (undefined1 (*) [64])
              (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
              (long)bottom_top_blob->data);
    for (iVar6 = 0; iVar6 + 0xf < iVar2; iVar6 = iVar6 + 0x10) {
      auVar10 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_HardSigmoid).alpha));
      fVar1 = (this->super_HardSigmoid).beta;
      auVar11._4_4_ = fVar1;
      auVar11._0_4_ = fVar1;
      auVar11._8_4_ = fVar1;
      auVar11._12_4_ = fVar1;
      auVar11._16_4_ = fVar1;
      auVar11._20_4_ = fVar1;
      auVar11._24_4_ = fVar1;
      auVar11._28_4_ = fVar1;
      auVar11._32_4_ = fVar1;
      auVar11._36_4_ = fVar1;
      auVar11._40_4_ = fVar1;
      auVar11._44_4_ = fVar1;
      auVar11._48_4_ = fVar1;
      auVar11._52_4_ = fVar1;
      auVar11._56_4_ = fVar1;
      auVar11._60_4_ = fVar1;
      auVar11 = vfmadd213ps_avx512f(auVar10,*pauVar5,auVar11);
      auVar11 = vmaxps_avx512f(auVar11,ZEXT1664(ZEXT816(0) << 0x40));
      auVar11 = vminps_avx512f(auVar11,auVar9);
      *pauVar5 = auVar11;
      pauVar5 = pauVar5 + 1;
    }
    for (; iVar6 + 7 < iVar2; iVar6 = iVar6 + 8) {
      fVar1 = (this->super_HardSigmoid).alpha;
      auVar15._4_4_ = fVar1;
      auVar15._0_4_ = fVar1;
      auVar15._8_4_ = fVar1;
      auVar15._12_4_ = fVar1;
      auVar15._16_4_ = fVar1;
      auVar15._20_4_ = fVar1;
      auVar15._24_4_ = fVar1;
      auVar15._28_4_ = fVar1;
      fVar1 = (this->super_HardSigmoid).beta;
      auVar8._4_4_ = fVar1;
      auVar8._0_4_ = fVar1;
      auVar8._8_4_ = fVar1;
      auVar8._12_4_ = fVar1;
      auVar8._16_4_ = fVar1;
      auVar8._20_4_ = fVar1;
      auVar8._24_4_ = fVar1;
      auVar8._28_4_ = fVar1;
      auVar8 = vfmadd213ps_avx512vl(auVar15,*(undefined1 (*) [32])*pauVar5,auVar8);
      auVar8 = vmaxps_avx(auVar8,ZEXT1632(ZEXT816(0) << 0x40));
      auVar8 = vminps_avx(auVar8,auVar12);
      *(undefined1 (*) [32])*pauVar5 = auVar8;
      pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
    }
    for (; iVar6 + 3 < iVar2; iVar6 = iVar6 + 4) {
      fVar1 = (this->super_HardSigmoid).alpha;
      auVar14._4_4_ = fVar1;
      auVar14._0_4_ = fVar1;
      auVar14._8_4_ = fVar1;
      auVar14._12_4_ = fVar1;
      fVar1 = (this->super_HardSigmoid).beta;
      auVar7._4_4_ = fVar1;
      auVar7._0_4_ = fVar1;
      auVar7._8_4_ = fVar1;
      auVar7._12_4_ = fVar1;
      auVar7 = vfmadd213ps_avx512vl(auVar14,*(undefined1 (*) [16])*pauVar5,auVar7);
      auVar7 = vmaxps_avx(auVar7,ZEXT816(0) << 0x40);
      auVar7 = vminps_avx(auVar7,auVar13);
      *(undefined1 (*) [16])*pauVar5 = auVar7;
      pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
    }
    for (; iVar6 < iVar2; iVar6 = iVar6 + 1) {
      fVar1 = *(float *)*pauVar5;
      uVar16 = 0;
      if (((this->super_HardSigmoid).lower <= fVar1) &&
         (uVar16 = 0x3f800000, fVar1 <= (this->super_HardSigmoid).upper)) {
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)(this->super_HardSigmoid).alpha)
                                 ,ZEXT416((uint)(this->super_HardSigmoid).beta));
        uVar16 = auVar7._0_4_;
      }
      *(undefined4 *)*pauVar5 = uVar16;
      pauVar5 = (undefined1 (*) [64])(*pauVar5 + 4);
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}